

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

void __thiscall
bssl::InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::Shrink
          (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this,
          size_t new_size)

{
  ulong uVar1;
  long lVar2;
  char *this_00;
  
  uVar1 = (ulong)this->size_;
  if (new_size <= uVar1) {
    if (uVar1 != new_size) {
      this_00 = this->storage_ + new_size * 8;
      lVar2 = new_size - uVar1;
      do {
        std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)this_00);
        this_00 = this_00 + 8;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
    this->size_ = (PackedSize<2UL>)new_size;
    return;
  }
  abort();
}

Assistant:

void Shrink(size_t new_size) {
    BSSL_CHECK(new_size <= size_);
    std::destroy_n(data() + new_size, size_ - new_size);
    size_ = static_cast<PackedSize<N>>(new_size);
  }